

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O1

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessStartStateList::ProcessList
          (ProcessStartStateList *this)

{
  ParserPOMDPFormat_Spirit *pPVar1;
  uint *puVar2;
  pointer puVar3;
  undefined1 auVar4 [16];
  pointer pdVar5;
  pointer pdVar6;
  size_type __n;
  uint *puVar7;
  StateDistribution *p;
  long lVar8;
  long lVar9;
  bool bVar10;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  double u_prob;
  allocator_type local_59;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_38;
  double local_20;
  value_type_conflict3 local_18;
  undefined1 auVar11 [64];
  
  __n = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                               super_MultiAgentDecisionProcessDiscrete.
                               super_MultiAgentDecisionProcess + 0x30))();
  auVar11._8_56_ = extraout_var;
  auVar11._0_8_ = extraout_XMM0_Qa;
  pPVar1 = this->_m_po;
  lVar8 = (long)(pPVar1->_m_startStateListSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pPVar1->_m_startStateListSI).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  bVar10 = pPVar1->_m_startStateListExclude == false;
  lVar9 = __n - lVar8;
  if (bVar10) {
    lVar9 = lVar8;
  }
  auVar4 = vcvtusi2sd_avx512f(auVar11._0_16_,lVar9);
  local_20 = 1.0 / auVar4._0_8_;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (bVar10) {
    local_18 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector(&local_38,__n,&local_18,&local_59);
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              (&local_38,__n,&local_20,(allocator_type *)&local_18);
  }
  pdVar6 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pdVar5 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pdVar5 != (pointer)0x0) {
    operator_delete(pdVar5,(long)pdVar6 - (long)pdVar5);
  }
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pPVar1 = this->_m_po;
  puVar7 = (pPVar1->_m_startStateListSI).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (pPVar1->_m_startStateListSI).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar7 != puVar2) {
    bVar10 = pPVar1->_m_startStateListExclude;
    do {
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[*puVar7] = (double)((ulong)!(bool)(bVar10 & 1) * (long)local_20);
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  p = (StateDistribution *)operator_new(0x20);
  p->_vptr_StateDistribution = (_func_int **)&PTR__StateDistribution_0059cc60;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(p + 1),&local_58);
  p->_vptr_StateDistribution = (_func_int **)&PTR__StateDistributionVector_0059cb98;
  MADPComponentDiscreteStates::SetISD
            (&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
              super_MultiAgentDecisionProcessDiscrete._m_S,p);
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  pPVar1 = this->_m_po;
  puVar3 = (pPVar1->_m_startStateListSI).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pPVar1->_m_startStateListSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar3) {
    (pPVar1->_m_startStateListSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProcessList() const
            {
                size_t nrS = _m_po->GetPOMDPDiscrete()->GetNrStates();
                size_t listSize = _m_po->_m_startStateListSI.size();
                size_t nrIncS = (_m_po->_m_startStateListExclude)? nrS - listSize:
                    listSize;
                double u_prob = 1.0 / nrIncS;
                
                std::vector<double> init_probs;
                if(!_m_po->_m_startStateListExclude)
                    //elems in list get uniform prob.
                    init_probs = std::vector<double>(nrS, 0.0);
                else //other elems get uniform prob
                    init_probs = std::vector<double>(nrS, u_prob);

                std::vector<Index>::iterator it = _m_po->_m_startStateListSI.begin();
                std::vector<Index>::iterator last = _m_po->_m_startStateListSI.end();
                while(it != last)
                {
                    init_probs[*it] = _m_po->_m_startStateListExclude? 
                        0.0 : u_prob;
                    it++;
                }
                StateDistributionVector *isd=new StateDistributionVector(init_probs);
                _m_po->GetPOMDPDiscrete()->SetISD(isd);
                init_probs.clear();                
                _m_po->_m_startStateListSI.clear();

            }